

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.hpp
# Opt level: O1

void __thiscall helics::apps::AsioBrokerServer::~AsioBrokerServer(AsioBrokerServer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->super_TypedBrokerServer)._vptr_TypedBrokerServer =
       (_func_int **)&PTR__AsioBrokerServer_0054ef20;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if ((this->mainLoopThread)._M_id._M_thread == 0) {
    CLI::std::
    vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
    ::~vector(&this->udpPortData);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->udpserver).
             super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    CLI::std::
    vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
    ::~vector(&this->tcpPortData);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->tcpserver).
             super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    operator_delete(this,0xb8);
    return;
  }
  std::terminate();
}

Assistant:

explicit AsioBrokerServer(std::string_view server_name): name_(server_name) {}